

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O0

DdNode * extraBddReduceVarSet(DdManager *dd,DdNode *bVars,DdNode *bF)

{
  DdNode *pDVar1;
  DdNode *f;
  DdHalfWord local_80;
  DdHalfWord local_78;
  DdNode *bVarsExtra;
  int LevelF;
  DdNode *bTemp;
  DdNode *bVarsLower;
  DdNode *bVarsThis;
  DdNode *bF1;
  DdNode *bF0;
  DdNode *bFR;
  DdNode *bRes;
  DdNode *bF_local;
  DdNode *bVars_local;
  DdManager *dd_local;
  
  pDVar1 = (DdNode *)((ulong)bF & 0xfffffffffffffffe);
  dd_local = (DdManager *)bVars;
  if (((pDVar1->index != 0x7fffffff) && (bVars != dd->one)) &&
     (dd_local = (DdManager *)cuddCacheLookup2(dd,extraBddReduceVarSet,bVars,bF),
     dd_local == (DdManager *)0x0)) {
    bVarsLower = bVars;
    while( true ) {
      if (bVarsLower->index == 0x7fffffff) {
        local_78 = bVarsLower->index;
      }
      else {
        local_78 = dd->perm[bVarsLower->index];
      }
      if (dd->perm[pDVar1->index] <= (int)local_78) break;
      bVarsLower = (bVarsLower->type).kids.T;
    }
    if (bVarsLower->index == 0x7fffffff) {
      local_80 = bVarsLower->index;
    }
    else {
      local_80 = dd->perm[bVarsLower->index];
    }
    if (dd->perm[pDVar1->index] == local_80) {
      bTemp = (bVarsLower->type).kids.T;
    }
    else {
      bTemp = bVarsLower;
    }
    if (pDVar1 == bF) {
      bF1 = (pDVar1->type).kids.E;
      bVarsThis = (pDVar1->type).kids.T;
    }
    else {
      bF1 = (DdNode *)((ulong)(pDVar1->type).kids.E ^ 1);
      bVarsThis = (DdNode *)((ulong)(pDVar1->type).kids.T ^ 1);
    }
    pDVar1 = extraBddReduceVarSet(dd,bTemp,bF1);
    if (pDVar1 == (DdNode *)0x0) {
      dd_local = (DdManager *)0x0;
    }
    else {
      *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
      f = extraBddReduceVarSet(dd,pDVar1,bVarsThis);
      if (f == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,pDVar1);
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)f & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)f & 0xfffffffffffffffe) + 4) + 1;
        Cudd_RecursiveDeref(dd,pDVar1);
        bFR = f;
        if (bVarsLower != bVars) {
          pDVar1 = cuddBddExistAbstractRecur(dd,bVars,bVarsLower);
          if (pDVar1 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,f);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
          bFR = cuddBddAndRecur(dd,f,pDVar1);
          if (bFR == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,f);
            Cudd_RecursiveDeref(dd,pDVar1);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)bFR & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)bFR & 0xfffffffffffffffe) + 4) + 1;
          Cudd_RecursiveDeref(dd,f);
          Cudd_RecursiveDeref(dd,pDVar1);
        }
        *(int *)(((ulong)bFR & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)bFR & 0xfffffffffffffffe) + 4) + -1;
        cuddCacheInsert2(dd,extraBddReduceVarSet,bVars,bF,bFR);
        dd_local = (DdManager *)bFR;
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode * extraBddReduceVarSet( 
  DdManager * dd,    /* the DD manager */
  DdNode * bVars,    /* the set of variables to be reduced */
  DdNode * bF)       /* the function whose support is used for reduction */
{
    DdNode * bRes;
    DdNode * bFR = Cudd_Regular(bF);

    if ( cuddIsConstant(bFR) || bVars == b1 )
        return bVars;

    if ( (bRes = cuddCacheLookup2(dd, extraBddReduceVarSet, bVars, bF)) )
        return bRes;
    else
    {
        DdNode * bF0, * bF1;             
        DdNode * bVarsThis, * bVarsLower, * bTemp;
        int LevelF;

        // if LevelF is below LevelV, scroll through the vars in bVars 
        LevelF = dd->perm[bFR->index];
        for ( bVarsThis = bVars; LevelF > cuddI(dd,bVarsThis->index); bVarsThis = cuddT(bVarsThis) );
        // scroll also through the current var, because it should be not be added
        if ( LevelF == cuddI(dd,bVarsThis->index) )
            bVarsLower = cuddT(bVarsThis);
        else
            bVarsLower = bVarsThis;

        // cofactor the function
        if ( bFR != bF ) // bFunc is complemented 
        {
            bF0 = Cudd_Not( cuddE(bFR) );
            bF1 = Cudd_Not( cuddT(bFR) );
        }
        else
        {
            bF0 = cuddE(bFR);
            bF1 = cuddT(bFR);
        }

        // solve subproblems
        bRes = extraBddReduceVarSet( dd, bVarsLower, bF0 );
        if ( bRes == NULL ) 
            return NULL;
        cuddRef( bRes );

        bRes = extraBddReduceVarSet( dd, bTemp = bRes, bF1 );
        if ( bRes == NULL ) 
        {
            Cudd_RecursiveDeref( dd, bTemp );
            return NULL;
        }
        cuddRef( bRes );
        Cudd_RecursiveDeref( dd, bTemp );

        // the current var should not be added
        // add the skipped vars
        if ( bVarsThis != bVars )
        {
            DdNode * bVarsExtra;

            // extract the skipped variables
            bVarsExtra = cuddBddExistAbstractRecur( dd, bVars, bVarsThis );
            if ( bVarsExtra == NULL )
            {
                Cudd_RecursiveDeref( dd, bRes );
                return NULL;
            }
            cuddRef( bVarsExtra );

            // add these variables
            bRes = cuddBddAndRecur( dd, bTemp = bRes, bVarsExtra );
            if ( bRes == NULL ) 
            {
                Cudd_RecursiveDeref( dd, bTemp );
                Cudd_RecursiveDeref( dd, bVarsExtra );
                return NULL;
            }
            cuddRef( bRes );
            Cudd_RecursiveDeref( dd, bTemp );
            Cudd_RecursiveDeref( dd, bVarsExtra );
        }
        cuddDeref( bRes );

        cuddCacheInsert2( dd, extraBddReduceVarSet, bVars, bF, bRes );
        return bRes;
    }
}